

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

string * __thiscall
Catch::RunContext::getCurrentTestName_abi_cxx11_(string *__return_storage_ptr__,RunContext *this)

{
  if (this->m_activeTestCase == (TestCase *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this->m_activeTestCase);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string RunContext::getCurrentTestName() const {
        return m_activeTestCase
            ? m_activeTestCase->getTestCaseInfo().name
            : std::string();
    }